

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aflatin.c
# Opt level: O3

FT_Error af_latin_metrics_init(AF_LatinMetrics metrics,FT_Face face)

{
  FT_Vector *pFVar1;
  char cVar2;
  ushort uVar3;
  AF_Blue_Stringset AVar4;
  FT_GlyphSlot_conflict pFVar5;
  FT_Vector *pFVar6;
  long lVar7;
  long lVar8;
  FT_Pos FVar9;
  AF_Segment_conflict pAVar10;
  uint uVar11;
  FT_Long *pFVar12;
  FT_Error FVar13;
  AF_Blue_String AVar14;
  uint uVar15;
  uint uVar16;
  void *pvVar17;
  AF_StyleMetrics_conflict pAVar18;
  FT_ULong FVar19;
  long lVar20;
  ulong uVar21;
  AF_LatinBlueRec *pAVar22;
  AF_StyleMetrics_conflict pAVar23;
  AF_Segment_conflict pAVar24;
  uint uVar25;
  FT_Face pFVar26;
  AF_GlyphHintsRec_ *pAVar27;
  long lVar28;
  AF_Segment_conflict pAVar29;
  uint uVar30;
  long lVar31;
  long *plVar32;
  long lVar33;
  ulong uVar34;
  bool bVar35;
  ushort uVar36;
  long lVar37;
  int iVar38;
  char *pcVar39;
  FT_Face pFVar40;
  FT_Face pFVar41;
  ulong uVar42;
  long *plVar43;
  FT_Int old_best_point;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  ulong uVar47;
  FT_Face pFVar48;
  uint uVar49;
  ulong uVar50;
  ulong uVar51;
  long *plVar52;
  long lVar53;
  FT_Pos *pFVar54;
  uint uVar55;
  ulong uVar56;
  FT_CharMap charmap;
  FT_UInt FVar57;
  FT_Memory pFVar58;
  bool bVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  uint num_idx_1;
  FT_Long y_offset;
  AF_GlyphHintsRec hints [1];
  AF_LatinMetricsRec dummy [1];
  uint local_c3cc;
  char local_c3c8;
  uint local_c3b8;
  uint local_c3a8;
  uint local_c36c;
  ulong local_c368;
  AF_Blue_StringRec *local_c358;
  ulong local_c350;
  uint local_c32c;
  AF_LatinBlueRec *local_c328;
  ulong local_c320;
  FT_CharMap local_c318;
  FT_Face local_c310;
  ulong local_c308;
  FT_Face local_c300;
  FT_Face local_c2f8;
  char *local_c2f0;
  FT_UInt local_c2e8;
  undefined4 uStack_c2e4;
  long local_c2e0 [9];
  AF_GlyphHintsRec_ local_c298;
  undefined1 local_9018 [72];
  FT_UInt local_8fd0;
  
  charmap = face->charmap;
  metrics->units_per_em = (uint)face->units_per_EM;
  FVar13 = FT_Select_Charmap(face,FT_ENCODING_UNICODE);
  if (FVar13 != 0) goto LAB_0017e14e;
  pFVar58 = face->memory;
  local_c318 = charmap;
  memset(&local_c298.x_scale,0,0x1430);
  metrics->axis[0].width_count = 0;
  metrics->axis[1].width_count = 0;
  pAVar23 = (AF_StyleMetrics_conflict)
            af_script_classes[((metrics->root).style_class)->script]->standard_charstring;
  local_c298.memory = pFVar58;
  pvVar17 = (void *)hb_buffer_create();
  cVar2 = *(char *)&pAVar23->style_class;
  if (cVar2 != '\0') {
    do {
      while (cVar2 == ' ') {
        cVar2 = *(char *)((long)&pAVar23->style_class + 1);
        pAVar23 = (AF_StyleMetrics_conflict)((long)&pAVar23->style_class + 1);
      }
      pAVar18 = (AF_StyleMetrics_conflict)
                af_shaper_get_cluster((char *)pAVar23,&metrics->root,pvVar17,(uint *)local_9018);
      if (((uint)local_9018._0_4_ < 2) &&
         (FVar19 = af_shaper_get_elem(pAVar23,pvVar17,0,(FT_Long *)0x0,(FT_Long *)0x0), FVar19 != 0)
         ) {
        hb_buffer_destroy(pvVar17);
        FVar13 = FT_Load_Glyph(face,(FT_UInt)FVar19,1);
        if ((FVar13 != 0) || (pFVar5 = face->glyph, (pFVar5->outline).n_points < 1))
        goto LAB_0017d405;
        memset((AF_StyleMetrics_conflict)local_9018,0,0x8fe0);
        local_8fd0 = metrics->units_per_em;
        local_9018._16_8_ = 0x10000;
        local_9018._24_8_ = 0x10000;
        local_9018._32_16_ = (undefined1  [16])0x0;
        local_c298.scaler_flags = 0;
        local_c298.metrics = (AF_StyleMetrics_conflict)local_9018;
        local_9018._8_8_ = face;
        FVar13 = af_glyph_hints_reload(&local_c298,&pFVar5->outline);
        if (FVar13 != 0) goto LAB_0017d405;
        lVar20 = 0;
        bVar59 = true;
        goto LAB_0017e234;
      }
      cVar2 = *(char *)&pAVar18->style_class;
      pAVar23 = pAVar18;
    } while (cVar2 != '\0');
  }
  hb_buffer_destroy(pvVar17);
  goto LAB_0017d405;
  while( true ) {
    pFVar41 = pFVar40;
    if ((int)uVar49 < 0) {
      pFVar41 = (FT_Face)(ulong)uVar45;
    }
    if ((pcVar39[(int)uVar45] & 3U) == 1) {
      pFVar40 = pFVar41;
    }
    uVar49 = (uint)pFVar40;
    uVar25 = uVar55;
    uVar44 = uVar55;
    local_c3b8 = uVar45;
    if (uVar45 == uVar55) break;
LAB_0017dc30:
    uVar49 = (uint)pFVar40;
    uVar45 = (int)uVar50 + 1;
    if ((int)local_c3cc <= (int)uVar50) {
      uVar45 = uVar15;
    }
    uVar50 = (ulong)uVar45;
    uVar21 = pFVar6[(int)uVar45].y - lVar33;
    uVar47 = -uVar21;
    if (0 < (long)uVar21) {
      uVar47 = uVar21;
    }
    lVar31 = lVar33;
    uVar46 = local_c36c;
    if (5 < uVar47) {
      pFVar26 = (FT_Face)(pFVar1->x - lVar53);
      pFVar41 = (FT_Face)-(long)pFVar26;
      if (0 < (long)pFVar26) {
        pFVar41 = pFVar26;
      }
      if (pFVar41 <= pFVar48) {
        uVar25 = local_c3b8;
        uVar44 = local_c3cc;
        if ((int)uVar15 < (int)uVar45) {
          uVar44 = uVar45 - 1;
        }
        break;
      }
    }
  }
LAB_0017d922:
  lVar31 = lVar31 + lVar8;
  if (((int)uVar49 < 0) || ((int)uVar25 < 0)) {
LAB_0017d9aa:
    pFVar40 = pFVar41;
    if ((pcVar39[(int)uVar46] & 3U) == 1) {
      bVar59 = (pcVar39[(int)uVar44] & 3U) != 1;
      uVar15 = (uint)bVar59;
      if (!bVar59) goto LAB_0017d96c;
    }
    else {
      uVar15 = 1;
    }
    if ((uVar3 & 4) != 0) goto LAB_0017da2b;
  }
  else {
    uVar21 = pFVar6[uVar25].x - pFVar6[uVar49].x;
    uVar47 = -uVar21;
    if (0 < (long)uVar21) {
      uVar47 = uVar21;
    }
    if (uVar47 <= local_c308) goto LAB_0017d9aa;
LAB_0017d967:
    uVar15 = 0;
    pFVar40 = pFVar41;
  }
LAB_0017d96c:
  local_c3c8 = (char)uVar15;
  if ((uVar3 & 1) == 0) {
    if (lVar31 < lVar37) {
      lVar37 = lVar31;
      cVar2 = local_c3c8;
    }
  }
  else if (lVar37 < lVar31) {
    lVar37 = lVar31;
    cVar2 = local_c3c8;
  }
LAB_0017da2b:
  uVar30 = uVar30 + 1;
  if (uVar30 == uVar16) goto LAB_0017dcce;
  goto LAB_0017d597;
LAB_0017dcce:
  if ((lVar37 != -0x80000000) && (lVar37 != 0x7fffffff)) {
    if (cVar2 == '\0') {
      pAVar27 = (AF_GlyphHintsRec_ *)local_9018;
      uVar47 = local_c368;
      local_c368 = (ulong)((int)local_c368 + 1);
    }
    else {
      pAVar27 = &local_c298;
      uVar47 = local_c350;
      local_c350 = (ulong)((int)local_c350 + 1);
    }
    *(long *)((long)pAVar27->axis[0].embedded.segments + uVar47 * 8 + -0x70) = lVar37;
  }
LAB_0017dd29:
  pcVar39 = local_c2f0;
  if (*local_c2f0 == '\0') goto code_r0x0017dd3a;
  goto LAB_0017d518;
code_r0x0017dd3a:
  uVar16 = (uint)local_c368;
  uVar30 = (uint)local_c350;
  if (uVar16 == 0 && uVar30 == 0) goto LAB_0017def0;
  if (1 < uVar30) {
    uVar47 = 1;
    lVar37 = 0;
    do {
      lVar8 = *(long *)((long)local_c298.axis[0].embedded.segments + uVar47 * 8 + -0x70);
      lVar31 = lVar37;
      do {
        lVar53 = *(long *)((long)local_c298.axis[0].embedded.segments + lVar31 * 8 + -0x70);
        if (lVar53 <= lVar8) break;
        *(long *)((long)local_c298.axis[0].embedded.segments + lVar31 * 8 + -0x68) = lVar53;
        *(long *)((long)local_c298.axis[0].embedded.segments + lVar31 * 8 + -0x70) = lVar8;
        bVar59 = lVar31 != 0;
        lVar31 = lVar31 + -1;
      } while (bVar59);
      uVar47 = uVar47 + 1;
      lVar37 = lVar37 + 1;
    } while (uVar47 != local_c350);
  }
  if (uVar16 < 2) {
    uVar15 = metrics->axis[1].blue_count;
    pAVar22 = local_c328 + uVar15;
    metrics->axis[1].blue_count = uVar15 + 1;
    if (uVar16 == 0) {
      pAVar27 = &local_c298;
      goto LAB_0017deba;
    }
    if (uVar30 == 0) {
      uVar16 = 0;
      goto LAB_0017deb2;
    }
LAB_0017de44:
    lVar37 = *(long *)(local_9018 + (local_c368 >> 1) * 8);
    (pAVar22->ref).org = lVar37;
    lVar8 = *(long *)((long)local_c298.axis[0].embedded.segments + (ulong)(uVar30 >> 1) * 8 + -0x70)
    ;
    (pAVar22->shoot).org = lVar8;
    uVar16 = (uint)local_c358->properties;
    if ((lVar8 != lVar37) && (lVar8 <= lVar37 == ((local_c358->properties & 3) != 0))) {
      lVar37 = (lVar8 + lVar37) / 2;
      (pAVar22->shoot).org = lVar37;
      (pAVar22->ref).org = lVar37;
    }
  }
  else {
    uVar47 = 1;
    lVar37 = 0;
    do {
      lVar8 = *(long *)(local_9018 + uVar47 * 8);
      lVar31 = lVar37;
      do {
        if (*(long *)(local_9018 + lVar31 * 8) <= lVar8) break;
        *(long *)(local_9018 + lVar31 * 8 + 8) = *(long *)(local_9018 + lVar31 * 8);
        *(long *)(local_9018 + lVar31 * 8) = lVar8;
        bVar59 = lVar31 != 0;
        lVar31 = lVar31 + -1;
      } while (bVar59);
      uVar47 = uVar47 + 1;
      lVar37 = lVar37 + 1;
    } while (uVar47 != local_c368);
    uVar15 = metrics->axis[1].blue_count;
    pAVar22 = local_c328 + uVar15;
    metrics->axis[1].blue_count = uVar15 + 1;
    if (uVar30 != 0) goto LAB_0017de44;
LAB_0017deb2:
    uVar30 = uVar16;
    pAVar27 = (AF_GlyphHintsRec_ *)local_9018;
LAB_0017deba:
    FVar9 = *(FT_Pos *)((long)pAVar27->axis[0].embedded.segments + (ulong)(uVar30 >> 1) * 8 + -0x70)
    ;
    (pAVar22->shoot).org = FVar9;
    (pAVar22->ref).org = FVar9;
    uVar16 = (uint)local_c358->properties;
  }
  pAVar22->ascender = lVar28;
  pAVar22->descender = lVar20;
  uVar30 = uVar16 * 2 & 0xe;
  pAVar22->flags = uVar30;
  if ((uVar16 & 8) != 0) {
    pAVar22->flags = uVar30 | 0x10;
  }
LAB_0017def0:
  AVar14 = local_c358[1].string;
  local_c358 = local_c358 + 1;
  if (AVar14 == AF_BLUE_STRING_MAX) goto LAB_0017df12;
  goto LAB_0017d4ea;
  while( true ) {
    FVar57 = 0;
    af_latin_hints_link_segments(&local_c298,0,(AF_WidthRec *)0x0,(AF_Dimension)lVar20);
    lVar28 = (long)local_c298.axis[lVar20].num_segments;
    if (0 < lVar28) {
      pAVar24 = local_c298.axis[lVar20].segments;
      pAVar29 = pAVar24 + lVar28;
      FVar57 = 0;
      do {
        pAVar10 = pAVar24->link;
        if ((pAVar10 != (AF_Segment_conflict)0x0) &&
           ((FVar57 < 0x10 && pAVar24 < pAVar10) && pAVar24 == pAVar10->link)) {
          iVar38 = (int)pAVar24->pos - (int)pAVar10->pos;
          uVar3 = (ushort)iVar38;
          uVar36 = -uVar3;
          if (0 < iVar38) {
            uVar36 = uVar3;
          }
          uVar47 = (ulong)FVar57;
          FVar57 = FVar57 + 1;
          metrics->axis[lVar20].widths[uVar47].org = (ulong)uVar36;
        }
        pAVar24 = pAVar24 + 1;
      } while (pAVar24 < pAVar29);
    }
    local_c2e8 = FVar57;
    af_sort_and_quantize_widths(&local_c2e8,metrics->axis[lVar20].widths,(ulong)local_8fd0 / 100);
    metrics->axis[lVar20].width_count = local_c2e8;
    lVar20 = 1;
    bVar35 = !bVar59;
    bVar59 = false;
    if (bVar35) break;
LAB_0017e234:
    FVar13 = af_latin_hints_compute_segments(&local_c298,(AF_Dimension)lVar20);
    if (FVar13 != 0) break;
  }
LAB_0017d405:
  lVar20 = 0;
  bVar59 = true;
  do {
    bVar35 = bVar59;
    if (metrics->axis[lVar20].width_count == 0) {
      uVar47 = (ulong)metrics->units_per_em * 0x32 >> 0xb;
    }
    else {
      uVar47 = metrics->axis[lVar20].widths[0].org;
    }
    metrics->axis[lVar20].edge_distance_threshold = (long)uVar47 / 5;
    metrics->axis[lVar20].standard_width = uVar47;
    metrics->axis[lVar20].extra_light = '\0';
    lVar20 = 1;
    bVar59 = false;
  } while (bVar35);
  af_glyph_hints_done(&local_c298);
  AVar4 = ((metrics->root).style_class)->blue_stringset;
  uVar16 = metrics->units_per_em;
  pvVar17 = (void *)hb_buffer_create();
  AVar14 = af_blue_stringsets[AVar4].string;
  if (AVar14 != AF_BLUE_STRING_MAX) {
    local_c358 = af_blue_stringsets + AVar4;
    local_c308 = (ulong)(uVar16 >> 1) / 7;
    local_c328 = metrics->axis[1].blues;
LAB_0017d4ea:
    if (af_blue_strings[AVar14] != '\0') {
      local_c368 = 0;
      local_c350 = 0;
      lVar28 = 0;
      lVar20 = 0;
      pcVar39 = af_blue_strings + AVar14;
LAB_0017d518:
      pFVar40 = (FT_Face)(pcVar39 + -1);
      do {
        pFVar12 = &pFVar40->num_faces;
        pFVar40 = (FT_Face)((long)&pFVar40->num_faces + 1);
      } while (*(char *)((long)pFVar12 + 1) == ' ');
      local_c2f0 = af_shaper_get_cluster((char *)pFVar40,&metrics->root,pvVar17,&local_c32c);
      uVar16 = local_c32c;
      if (local_c32c != 0) {
        uVar3 = local_c358->properties;
        lVar37 = -0x80000000;
        if ((uVar3 & 1) == 0) {
          lVar37 = 0x7fffffff;
        }
        uVar30 = 0;
        cVar2 = '\0';
LAB_0017d597:
        FVar19 = af_shaper_get_elem((AF_StyleMetrics_conflict)pFVar40,pvVar17,uVar30,(FT_Long *)0x0,
                                    (FT_Long *)&local_c2e8);
        if (((FVar19 != 0) &&
            (pFVar40 = face, FVar13 = FT_Load_Glyph(face,(FT_UInt)FVar19,1), FVar13 == 0)) &&
           (pFVar5 = face->glyph, 2 < (pFVar5->outline).n_points)) {
          pFVar41 = (FT_Face)(long)(pFVar5->outline).n_contours;
          uVar15 = 0;
          if (0 < (long)pFVar41) {
            pFVar6 = (pFVar5->outline).points;
            pcVar39 = (pFVar5->outline).tags;
            lVar8 = CONCAT44(uStack_c2e4,local_c2e8);
            uVar47 = 0xffffffff;
            pFVar40 = (FT_Face)0x0;
            local_c3cc = 0;
            uVar45 = 0;
            lVar31 = 0;
            do {
              uVar55 = (uint)(pFVar5->outline).contours[(long)pFVar40];
              if ((int)uVar45 < (int)uVar55) {
                lVar53 = (long)(int)uVar45;
                uVar44 = (uint)uVar47;
                if ((uVar3 & 3) == 0) {
                  lVar33 = ((int)uVar55 - lVar53) + 1;
                  pFVar54 = &pFVar6[lVar53].y;
                  uVar49 = uVar45;
                  do {
                    lVar7 = *pFVar54;
                    lVar53 = lVar7 + lVar8;
                    if (((int)uVar47 < 0) || (lVar7 < lVar31)) {
                      uVar47 = (ulong)uVar49;
                      lVar31 = lVar7;
                      if (lVar53 <= lVar20) {
                        lVar20 = lVar53;
                      }
                    }
                    else if (lVar28 <= lVar53) {
                      lVar28 = lVar53;
                    }
                    uVar25 = (uint)uVar47;
                    uVar49 = uVar49 + 1;
                    pFVar54 = pFVar54 + 2;
                    lVar33 = lVar33 + -1;
                  } while (lVar33 != 0);
                }
                else {
                  lVar33 = ((int)uVar55 - lVar53) + 1;
                  pFVar54 = &pFVar6[lVar53].y;
                  uVar49 = uVar45;
                  do {
                    lVar7 = *pFVar54;
                    lVar53 = lVar7 + lVar8;
                    if (((int)uVar47 < 0) || (lVar31 < lVar7)) {
                      uVar47 = (ulong)uVar49;
                      lVar31 = lVar7;
                      if (lVar28 <= lVar53) {
                        lVar28 = lVar53;
                      }
                    }
                    else if (lVar53 <= lVar20) {
                      lVar20 = lVar53;
                    }
                    uVar25 = (uint)uVar47;
                    uVar49 = uVar49 + 1;
                    pFVar54 = pFVar54 + 2;
                    lVar33 = lVar33 + -1;
                  } while (lVar33 != 0);
                }
                if (uVar25 != uVar44) {
                  local_c3cc = uVar55;
                  uVar15 = uVar45;
                }
                uVar47 = (ulong)uVar25;
              }
              uVar45 = uVar55 + 1;
              pFVar40 = (FT_Face)((long)&pFVar40->num_faces + 1);
            } while (pFVar40 != pFVar41);
            uVar45 = (uint)uVar47;
            if (-1 < (int)uVar45) {
              pFVar26 = (FT_Face)pFVar6[uVar47].x;
              uVar21 = 0xffffffff;
              uVar42 = uVar47;
              uVar56 = 0xffffffff;
              if ((pcVar39[uVar47] & 3U) == 1) {
                uVar21 = uVar47;
                uVar56 = uVar47;
              }
              do {
                uVar55 = (uint)uVar42;
                uVar44 = uVar55 - 1;
                if ((int)uVar55 <= (int)uVar15) {
                  uVar44 = local_c3cc;
                }
                uVar51 = pFVar6[(int)uVar44].y - lVar31;
                uVar42 = -uVar51;
                if (0 < (long)uVar51) {
                  uVar42 = uVar51;
                }
                uVar51 = uVar47;
                if (5 < uVar42) {
                  uVar50 = pFVar6[(int)uVar44].x - (long)pFVar26;
                  uVar34 = -uVar50;
                  if (0 < (long)uVar50) {
                    uVar34 = uVar50;
                  }
                  if (uVar34 <= uVar42 * 0x14) break;
                }
                uVar55 = (uint)uVar56;
                if ((int)(uint)uVar56 < 0) {
                  uVar55 = uVar44;
                }
                if ((pcVar39[(int)uVar44] & 3U) == 1) {
                  uVar21 = (ulong)uVar44;
                  uVar56 = (ulong)uVar55;
                }
                uVar42 = (ulong)uVar44;
                uVar55 = uVar45;
              } while (uVar44 != uVar45);
              do {
                uVar25 = (uint)uVar56;
                uVar49 = (uint)uVar21;
                uVar44 = (int)uVar51 + 1;
                if ((int)local_c3cc <= (int)uVar51) {
                  uVar44 = uVar15;
                }
                pFVar41 = (FT_Face)(long)(int)uVar44;
                pFVar1 = pFVar6 + (long)pFVar41;
                uVar34 = pFVar6[(long)pFVar41].y - lVar31;
                uVar42 = -uVar34;
                if (0 < (long)uVar34) {
                  uVar42 = uVar34;
                }
                if (5 < uVar42) {
                  uVar50 = pFVar1->x - (long)pFVar26;
                  uVar34 = -uVar50;
                  if (0 < (long)uVar50) {
                    uVar34 = uVar50;
                  }
                  uVar50 = uVar51;
                  if (uVar34 <= uVar42 * 0x14) break;
                }
                if ((int)uVar49 < 0) {
                  uVar49 = uVar44;
                }
                bVar59 = (pcVar39[(long)pFVar41] & 3U) == 1;
                if (bVar59) {
                  uVar21 = (ulong)uVar49;
                }
                uVar49 = (uint)uVar21;
                if (bVar59) {
                  uVar56 = (ulong)uVar44;
                }
                uVar25 = (uint)uVar56;
                uVar50 = uVar47;
                uVar51 = (ulong)uVar44;
              } while (uVar44 != uVar45);
              uVar44 = (uint)uVar50;
              uVar46 = uVar55;
              if ((uVar3 & 0x10) != 0) {
                local_c2f8 = (FT_Face)((ulong)metrics->units_per_em / 0x19);
                pFVar40 = (FT_Face)(pFVar6[(int)uVar44].x - pFVar6[(int)uVar55].x);
                pFVar41 = (FT_Face)-(long)pFVar40;
                if (0 < (long)pFVar40) {
                  pFVar41 = pFVar40;
                }
                if ((pFVar41 < local_c2f8) &&
                   (pFVar41 = (FT_Face)(ulong)(local_c3cc - uVar15),
                   (int)((uVar44 - uVar55) + 2) <= (int)(local_c3cc - uVar15))) {
                  do {
                    uVar11 = (int)uVar47 - 1;
                    if ((int)uVar47 <= (int)uVar15) {
                      uVar11 = local_c3cc;
                    }
                    uVar47 = (ulong)uVar11;
                    pFVar40 = (FT_Face)pFVar6[(int)uVar11].x;
                  } while ((pFVar40 == pFVar26) && (uVar11 != uVar45));
                  if (uVar11 == uVar45) goto LAB_0017da2b;
                  bVar59 = false;
                  local_c3a8 = 0;
                  local_c3b8 = 0;
                  local_c36c = uVar44;
                  do {
                    uVar45 = (uint)uVar50;
                    if (bVar59) {
                      lVar53 = (long)(int)local_c36c;
                    }
                    else {
                      lVar53 = (long)(int)uVar45;
                      local_c3b8 = 0xffffffff;
                      local_c3a8 = 0xffffffff;
                      local_c36c = uVar45;
                      if ((pcVar39[lVar53] & 3U) == 1) {
                        local_c3b8 = uVar45;
                        local_c3a8 = uVar45;
                      }
                    }
                    uVar11 = uVar45 + 1;
                    if ((int)local_c3cc <= (int)uVar45) {
                      uVar11 = uVar15;
                    }
                    uVar50 = (ulong)uVar11;
                    lVar33 = pFVar6[lVar53].y;
                    pFVar41 = (FT_Face)(lVar31 - lVar33);
                    pFVar48 = (FT_Face)-(long)pFVar41;
                    if (0 < (long)pFVar41) {
                      pFVar48 = pFVar41;
                    }
                    local_c310 = pFVar40;
                    if ((FT_Face)(ulong)(metrics->units_per_em >> 2) < pFVar48) {
                      bVar59 = false;
                    }
                    else {
                      uVar21 = pFVar6[(int)uVar11].y - lVar33;
                      uVar47 = -uVar21;
                      if (0 < (long)uVar21) {
                        uVar47 = uVar21;
                      }
                      lVar53 = pFVar6[lVar53].x;
                      pFVar48 = (FT_Face)(pFVar6[(int)uVar11].x - lVar53);
                      pFVar41 = (FT_Face)-(long)pFVar48;
                      if (0 < (long)pFVar48) {
                        pFVar41 = pFVar48;
                      }
                      pFVar48 = (FT_Face)(uVar47 * 0x14);
                      local_c320 = uVar50;
                      if ((uVar47 < 6) || (pFVar48 < pFVar41)) {
                        uVar45 = local_c3a8;
                        if ((int)local_c3a8 < 0) {
                          uVar45 = uVar11;
                        }
                        if ((pcVar39[(int)uVar11] & 3U) == 1) {
                          local_c3b8 = uVar11;
                          local_c3a8 = uVar45;
                        }
                        bVar59 = true;
                        local_c300 = pFVar48;
                        if ((lVar53 < pFVar6[(int)uVar11].x == (long)pFVar40 < (long)pFVar26) &&
                           (local_c2f8 <= pFVar41)) {
                          pFVar40 = (FT_Face)(ulong)local_c3a8;
                          goto LAB_0017dc30;
                        }
                      }
                      else {
                        bVar59 = false;
                      }
                    }
                  } while (uVar11 != uVar55);
                }
              }
              goto LAB_0017d922;
            }
            goto LAB_0017d967;
          }
          lVar31 = 0;
          pFVar40 = pFVar41;
          goto LAB_0017d96c;
        }
        goto LAB_0017da2b;
      }
      goto LAB_0017dd29;
    }
    goto LAB_0017def0;
  }
LAB_0017df12:
  hb_buffer_destroy(pvVar17);
  uVar16 = metrics->axis[1].blue_count;
  uVar47 = (ulong)uVar16;
  if (uVar47 != 0) {
    lVar20 = uVar47 - 1;
    auVar60._8_4_ = (int)lVar20;
    auVar60._0_8_ = lVar20;
    auVar60._12_4_ = (int)((ulong)lVar20 >> 0x20);
    pAVar22 = metrics->axis[1].blues + 1;
    uVar21 = 0;
    auVar60 = auVar60 ^ _DAT_00187030;
    auVar61 = _DAT_0018d5f0;
    do {
      auVar62 = auVar61 ^ _DAT_00187030;
      if ((bool)(~(auVar62._4_4_ == auVar60._4_4_ && auVar60._0_4_ < auVar62._0_4_ ||
                  auVar60._4_4_ < auVar62._4_4_) & 1)) {
        *(AF_LatinBlueRec **)((long)local_c2e0 + (uVar21 - 8)) = pAVar22 + -1;
      }
      if ((auVar62._12_4_ != auVar60._12_4_ || auVar62._8_4_ <= auVar60._8_4_) &&
          auVar62._12_4_ <= auVar60._12_4_) {
        *(AF_LatinBlueRec **)((long)local_c2e0 + uVar21) = pAVar22;
      }
      lVar20 = auVar61._8_8_;
      auVar61._0_8_ = auVar61._0_8_ + 2;
      auVar61._8_8_ = lVar20 + 2;
      uVar21 = uVar21 + 0x10;
      pAVar22 = pAVar22 + 2;
    } while ((uVar47 * 8 + 8 & 0xfffffffffffffff0) != uVar21);
    if (uVar16 != 1) {
      uVar21 = 1;
      lVar20 = 0;
      do {
        plVar32 = (long *)local_c2e0[uVar21 - 1];
        plVar43 = plVar32 + 3;
        if ((*(byte *)(plVar32 + 8) & 6) != 0) {
          plVar43 = plVar32;
        }
        lVar28 = *plVar43;
        lVar37 = lVar20;
        do {
          plVar43 = (long *)local_c2e0[lVar37 + -1];
          plVar52 = plVar43;
          if ((*(byte *)(plVar43 + 8) & 6) == 0) {
            plVar52 = plVar43 + 3;
          }
          if (*plVar52 <= lVar28) break;
          local_c2e0[lVar37] = (long)plVar43;
          local_c2e0[lVar37 + -1] = (long)plVar32;
          bVar59 = lVar37 != 0;
          lVar37 = lVar37 + -1;
        } while (bVar59);
        uVar21 = uVar21 + 1;
        lVar20 = lVar20 + 1;
      } while (uVar21 != uVar47);
      if (uVar16 - 1 != 0) {
        uVar30 = *(uint *)((long *)CONCAT44(uStack_c2e4,local_c2e8) + 8);
        uVar47 = 0;
        plVar32 = (long *)CONCAT44(uStack_c2e4,local_c2e8);
        do {
          if ((uVar30 & 6) == 0) {
            lVar20 = 0;
          }
          else {
            lVar20 = 0x18;
          }
          plVar52 = (long *)local_c2e0[uVar47];
          uVar30 = *(uint *)(plVar52 + 8);
          plVar43 = plVar52;
          if ((uVar30 & 6) != 0) {
            plVar43 = plVar52 + 3;
          }
          if (*plVar43 < *(long *)((long)plVar32 + lVar20)) {
            *(long *)((long)plVar32 + lVar20) = *plVar43;
          }
          uVar47 = uVar47 + 1;
          plVar32 = plVar52;
        } while (uVar16 - 1 != uVar47);
      }
    }
  }
  local_c298.memory = (FT_Memory)0x0;
  local_9018[0] = '0';
  local_9018[1] = ' ';
  local_9018[2] = '1';
  local_9018[3] = ' ';
  local_9018[4] = '2';
  local_9018[5] = ' ';
  local_9018[6] = '3';
  local_9018[7] = ' ';
  local_9018[8] = '4';
  local_9018[9] = ' ';
  local_9018[10] = '5';
  local_9018[0xb] = ' ';
  local_9018[0xc] = '6';
  local_9018[0xd] = ' ';
  local_9018[0xe] = '7';
  local_9018[0xf] = ' ';
  local_9018._16_4_ = 0x392038;
  bVar59 = true;
  pvVar17 = (void *)hb_buffer_create();
  pAVar23 = (AF_StyleMetrics_conflict)local_9018;
  pFVar58 = (FT_Memory)0x0;
  do {
    while( true ) {
      do {
        pAVar18 = pAVar23;
        if (*(char *)&pAVar18->style_class == '\0') {
          bVar59 = true;
          goto LAB_0017e131;
        }
        pAVar23 = (AF_StyleMetrics_conflict)
                  af_shaper_get_cluster((char *)pAVar18,&metrics->root,pvVar17,&local_c2e8);
      } while ((1 < local_c2e8) ||
              (FVar19 = af_shaper_get_elem(pAVar18,pvVar17,0,(FT_Long *)&local_c298,(FT_Long *)0x0),
              FVar19 == 0));
      if (!bVar59) break;
      bVar59 = false;
      pFVar58 = local_c298.memory;
    }
    bVar59 = false;
  } while (local_c298.memory == pFVar58);
LAB_0017e131:
  hb_buffer_destroy(pvVar17);
  (metrics->root).digits_have_same_width = bVar59;
  charmap = local_c318;
LAB_0017e14e:
  FT_Set_Charmap(face,charmap);
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_latin_metrics_init( AF_LatinMetrics  metrics,
                         FT_Face          face )
  {
    FT_CharMap  oldmap = face->charmap;


    metrics->units_per_em = face->units_per_EM;

    if ( !FT_Select_Charmap( face, FT_ENCODING_UNICODE ) )
    {
      af_latin_metrics_init_widths( metrics, face );
      af_latin_metrics_init_blues( metrics, face );
      af_latin_metrics_check_digits( metrics, face );
    }

    FT_Set_Charmap( face, oldmap );
    return FT_Err_Ok;
  }